

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O2

bool jsoncons::detail::dtoa_general<std::__cxx11::wstring>
               (double val,char decimal_point,
               basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *result)

{
  uint uVar1;
  wchar_t wVar2;
  bool bVar3;
  type_conflict7 tVar4;
  chars_to to_double;
  char buffer [100];
  
  if ((val == 0.0) && (!NAN(val))) {
    wVar2 = (wchar_t)result;
    std::__cxx11::wstring::push_back(wVar2);
    std::__cxx11::wstring::push_back(wVar2);
    std::__cxx11::wstring::push_back(wVar2);
    return true;
  }
  chars_to::chars_to(&to_double);
  uVar1 = snprintf(buffer,100,"%1.*g",val,0xf);
  if (-1 < (int)uVar1) {
    tVar4 = chars_to::operator()(&to_double,buffer,100);
    if (((tVar4 == val) && (!NAN(tVar4) && !NAN(val))) ||
       (uVar1 = snprintf(buffer,100,"%1.*g",val,0x11), -1 < (int)uVar1)) {
      bVar3 = true;
      dump_buffer<std::__cxx11::wstring>(buffer,(ulong)uVar1,decimal_point,result);
      goto LAB_004903fd;
    }
  }
  bVar3 = false;
LAB_004903fd:
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&to_double);
  return bVar3;
}

Assistant:

bool dtoa_general(double val, char decimal_point, Result& result, std::false_type)
    {
        if (val == 0)
        {
            result.push_back('0');
            result.push_back('.');
            result.push_back('0');
            return true;
        }

        const jsoncons::detail::chars_to to_double;

        char buffer[100];
        int precision = std::numeric_limits<double>::digits10;
        int length = snprintf(buffer, sizeof(buffer), "%1.*g", precision, val);
        if (length < 0)
        {
            return false;
        }
        if (to_double(buffer, sizeof(buffer)) != val)
        {
            const int precision2 = std::numeric_limits<double>::max_digits10;
            length = snprintf(buffer, sizeof(buffer), "%1.*g", precision2, val);
            if (length < 0)
            {
                return false;
            }
        }
        dump_buffer(buffer, length, decimal_point, result);
        return true;
    }